

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::setRecordGridInfo(Amr *this,string *filename)

{
  allocator local_31;
  string local_30;
  
  this->record_grid_info = 1;
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    std::ofstream::open((char *)&this->gridlog,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
    if (*(int *)(&this->field_0x2f0 + *(long *)(*(long *)&this->gridlog + -0x18)) != 0) {
      FileOpenFailed(filename);
    }
  }
  std::__cxx11::string::string((string *)&local_30,"Amr::setRecordGridInfo",&local_31);
  ParallelDescriptor::Barrier(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void
Amr::setRecordGridInfo (const std::string& filename)
{
    record_grid_info = true;
    if (ParallelDescriptor::IOProcessor())
    {
        gridlog.open(filename.c_str(),std::ios::out|std::ios::app);
        if (!gridlog.good())
            amrex::FileOpenFailed(filename);
    }
    ParallelDescriptor::Barrier("Amr::setRecordGridInfo");
}